

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O2

void accumulate_counters_enc_workers(AV1_COMP *cpi,int num_workers)

{
  ulong uVar1;
  RD_COUNTS *pRVar2;
  uint64_t *puVar3;
  int *piVar4;
  uint *puVar5;
  uint8_t uVar6;
  void *pvVar7;
  long lVar8;
  int i_2;
  long lVar9;
  int (*paiVar10) [16];
  int (*paiVar11) [2];
  long lVar12;
  long lVar13;
  ulong uVar14;
  macroblock *x;
  bool bVar15;
  
  uVar14 = (ulong)(uint)num_workers;
  while (0 < (int)uVar14) {
    uVar1 = uVar14 - 1;
    pvVar7 = (cpi->mt_info).workers[uVar1].data1;
    x = *(macroblock **)((long)pvVar7 + 8);
    cpi->intrabc_used = cpi->intrabc_used | *(uint *)(x[1].e_mbd.plane[0].seg_iqmatrix[7] + 3);
    cpi->deltaq_used =
         cpi->deltaq_used | *(uint *)((long)x[1].e_mbd.plane[0].seg_iqmatrix[7] + 0x1c);
    if (((cpi->common).current_frame.frame_type & 0xfd) != 0) {
      av1_accumulate_rtc_counters(cpi,x);
      x = *(macroblock **)((long)pvVar7 + 8);
    }
    cpi->palette_pixel_num = cpi->palette_pixel_num + x->palette_pixels;
    if ((ThreadData_conflict *)x != &cpi->td) {
      if ((cpi->sf).inter_sf.mv_cost_upd_level != INTERNAL_COST_UPD_OFF) {
        aom_free(x[1].plane[0].src_diff);
        x = *(macroblock **)((long)pvVar7 + 8);
        x[1].plane[0].src_diff = (int16_t *)0x0;
      }
      if ((cpi->sf).intra_sf.dv_cost_upd_level != INTERNAL_COST_UPD_OFF) {
        aom_free(x[1].plane[0].dqcoeff);
        x = *(macroblock **)((long)pvVar7 + 8);
        x[1].plane[0].dqcoeff = (tran_low_t *)0x0;
      }
    }
    uVar6 = ((cpi->common).seq_params)->monochrome;
    aom_free((x->txfm_search_info).mb_rd_record);
    (x->txfm_search_info).mb_rd_record = (MB_RD_RECORD *)0x0;
    aom_free(x->inter_modes_info);
    x->inter_modes_info = (inter_modes_info *)0x0;
    av1_dealloc_src_diff_buf(x,(uint)(uVar6 == '\0') * 2 + 1);
    aom_free((x->e_mbd).seg_mask);
    (x->e_mbd).seg_mask = (uint8_t *)0x0;
    aom_free(x->winner_mode_stats);
    x->winner_mode_stats = (WinnerModeStats *)0x0;
    aom_free(x->dqcoeff_buf);
    x->dqcoeff_buf = (tran_low_t *)0x0;
    bVar15 = uVar14 != 1;
    uVar14 = uVar1;
    if (bVar15) {
      av1_accumulate_frame_counts
                (&cpi->counts,*(FRAME_COUNTS **)(*(long *)((long)pvVar7 + 8) + 0x25c58));
      lVar8 = *(long *)((long)pvVar7 + 8);
      pRVar2 = &(cpi->td).rd_counts;
      uVar1._0_4_ = pRVar2->compound_ref_used_flag;
      uVar1._4_4_ = pRVar2->skip_mode_used_flag;
      uVar1 = uVar1 | *(ulong *)(lVar8 + 0x256c0);
      pRVar2->compound_ref_used_flag = (int)uVar1;
      pRVar2->skip_mode_used_flag = (int)(uVar1 >> 0x20);
      lVar9 = lVar8 + 0x256c8;
      paiVar10 = (cpi->td).rd_counts.tx_type_used;
      for (lVar12 = 0; lVar12 != 0x13; lVar12 = lVar12 + 1) {
        for (lVar13 = 0; lVar13 != 0x10; lVar13 = lVar13 + 1) {
          (*paiVar10)[lVar13] = (*paiVar10)[lVar13] + *(int *)(lVar9 + lVar13 * 4);
        }
        paiVar10 = paiVar10 + 1;
        lVar9 = lVar9 + 0x40;
      }
      lVar9 = lVar8 + 0x25b88;
      paiVar11 = (cpi->td).rd_counts.obmc_used;
      for (lVar12 = 0; lVar12 != 0x16; lVar12 = lVar12 + 1) {
        for (lVar13 = 0; lVar13 != 2; lVar13 = lVar13 + 1) {
          (*paiVar11)[lVar13] = (*paiVar11)[lVar13] + *(int *)(lVar9 + lVar13 * 4);
        }
        paiVar11 = paiVar11 + 1;
        lVar9 = lVar9 + 8;
      }
      for (lVar9 = 0; lVar9 != 2; lVar9 = lVar9 + 1) {
        piVar4 = (cpi->td).rd_counts.warped_used + lVar9;
        *piVar4 = *piVar4 + *(int *)(lVar8 + 0x25c38 + lVar9 * 4);
      }
      puVar3 = (cpi->td).rd_counts.seg_tmp_pred_cost;
      *puVar3 = *puVar3 + *(long *)(lVar8 + 0x25c48);
      puVar3 = (cpi->td).rd_counts.seg_tmp_pred_cost + 1;
      *puVar3 = *puVar3 + *(long *)(lVar8 + 0x25c50);
      piVar4 = &(cpi->td).rd_counts.newmv_or_intra_blocks;
      *piVar4 = *piVar4 + *(int *)(lVar8 + 0x25c40);
      puVar5 = &(cpi->td).mb.txfm_search_info.txb_split_count;
      *puVar5 = *puVar5 + *(int *)(lVar8 + 0x25618);
    }
  }
  return;
}

Assistant:

static inline void accumulate_counters_enc_workers(AV1_COMP *cpi,
                                                   int num_workers) {
  for (int i = num_workers - 1; i >= 0; i--) {
    AVxWorker *const worker = &cpi->mt_info.workers[i];
    EncWorkerData *const thread_data = (EncWorkerData *)worker->data1;
    cpi->intrabc_used |= thread_data->td->intrabc_used;
    cpi->deltaq_used |= thread_data->td->deltaq_used;
    // Accumulate rtc counters.
    if (!frame_is_intra_only(&cpi->common))
      av1_accumulate_rtc_counters(cpi, &thread_data->td->mb);
    cpi->palette_pixel_num += thread_data->td->mb.palette_pixels;
    if (thread_data->td != &cpi->td) {
      // Keep these conditional expressions in sync with the corresponding ones
      // in prepare_enc_workers().
      if (cpi->sf.inter_sf.mv_cost_upd_level != INTERNAL_COST_UPD_OFF) {
        aom_free(thread_data->td->mv_costs_alloc);
        thread_data->td->mv_costs_alloc = NULL;
      }
      if (cpi->sf.intra_sf.dv_cost_upd_level != INTERNAL_COST_UPD_OFF) {
        aom_free(thread_data->td->dv_costs_alloc);
        thread_data->td->dv_costs_alloc = NULL;
      }
    }
    av1_dealloc_mb_data(&thread_data->td->mb, av1_num_planes(&cpi->common));

    // Accumulate counters.
    if (i > 0) {
      av1_accumulate_frame_counts(&cpi->counts, thread_data->td->counts);
      accumulate_rd_opt(&cpi->td, thread_data->td);
      cpi->td.mb.txfm_search_info.txb_split_count +=
          thread_data->td->mb.txfm_search_info.txb_split_count;
#if CONFIG_SPEED_STATS
      cpi->td.mb.txfm_search_info.tx_search_count +=
          thread_data->td->mb.txfm_search_info.tx_search_count;
#endif  // CONFIG_SPEED_STATS
    }
  }
}